

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O1

void formatGraphicsItemHelper(QDebug *debug,QGraphicsItem *item)

{
  double dVar1;
  QGraphicsItem *pQVar2;
  QTextStream *pQVar3;
  QGraphicsItemPrivate *pQVar4;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QDebug local_58;
  undefined1 local_50 [8];
  QArrayData *local_48 [3];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = ((item->d_ptr).d)->parent;
  if (pQVar2 != (QGraphicsItem *)0x0) {
    pQVar3 = (QTextStream *)debug->stream;
    QVar5.m_data = (storage_type *)0x9;
    QVar5.m_size = (qsizetype)local_48;
    QString::fromUtf8(QVar5);
    QTextStream::operator<<(pQVar3,(QString *)local_48);
    if (local_48[0] != (QArrayData *)0x0) {
      LOCK();
      (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48[0],2,0x10);
      }
    }
    if (((QTextStream *)debug->stream)[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)debug->stream,' ');
    }
    QTextStream::operator<<((QTextStream *)debug->stream,pQVar2);
    if (((QTextStream *)debug->stream)[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)debug->stream,' ');
    }
  }
  pQVar3 = (QTextStream *)debug->stream;
  QVar6.m_data = (storage_type *)0x6;
  QVar6.m_size = (qsizetype)local_48;
  QString::fromUtf8(QVar6);
  QTextStream::operator<<(pQVar3,(QString *)local_48);
  if (local_48[0] != (QArrayData *)0x0) {
    LOCK();
    (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48[0],2,0x10);
    }
  }
  if (((QTextStream *)debug->stream)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<((QTextStream *)debug->stream,' ');
  }
  pQVar4 = (item->d_ptr).d;
  dVar1 = (pQVar4->pos).yp;
  QTextStream::operator<<((QTextStream *)debug->stream,(pQVar4->pos).xp);
  if (((QTextStream *)debug->stream)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<((QTextStream *)debug->stream,' ');
  }
  QTextStream::operator<<((QTextStream *)debug->stream,',');
  if (((QTextStream *)debug->stream)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<((QTextStream *)debug->stream,' ');
  }
  QTextStream::operator<<((QTextStream *)debug->stream,dVar1);
  if (((QTextStream *)debug->stream)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<((QTextStream *)debug->stream,' ');
  }
  dVar1 = ((item->d_ptr).d)->z;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    pQVar3 = (QTextStream *)debug->stream;
    QVar7.m_data = (storage_type *)0x4;
    QVar7.m_size = (qsizetype)local_48;
    QString::fromUtf8(QVar7);
    QTextStream::operator<<(pQVar3,(QString *)local_48);
    if (local_48[0] != (QArrayData *)0x0) {
      LOCK();
      (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48[0],2,0x10);
      }
    }
    if (((QTextStream *)debug->stream)[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)debug->stream,' ');
    }
    QTextStream::operator<<((QTextStream *)debug->stream,dVar1);
    if (((QTextStream *)debug->stream)[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)debug->stream,' ');
    }
  }
  if ((*(uint *)&((item->d_ptr).d)->field_0x163 & 0xfffff00) != 0) {
    pQVar3 = (QTextStream *)debug->stream;
    QVar8.m_data = (storage_type *)0x8;
    QVar8.m_size = (qsizetype)local_48;
    QString::fromUtf8(QVar8);
    QTextStream::operator<<(pQVar3,(QString *)local_48);
    if (local_48[0] != (QArrayData *)0x0) {
      LOCK();
      (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48[0],2,0x10);
      }
    }
    if (((QTextStream *)debug->stream)[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)debug->stream,' ');
    }
    local_58 = (QDebug)debug->stream;
    *(int *)(local_58.stream + 0x28) = *(int *)(local_58.stream + 0x28) + 1;
    operator<<((Stream *)local_50,
               (QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4>)SUB84(&local_58,0));
    QDebug::~QDebug((QDebug *)local_50);
    QDebug::~QDebug(&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void formatGraphicsItemHelper(QDebug debug, const QGraphicsItem *item)
{
    if (const QGraphicsItem *parent = item->parentItem())
          debug << ", parent=" << static_cast<const void *>(parent);
    debug << ", pos=";
    QtDebugUtils::formatQPoint(debug, item->pos());
    if (const qreal z = item->zValue())
        debug << ", z=" << z;
    if (item->flags())
        debug <<  ", flags=" << item->flags();
}